

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_passes
          (Impl *this,StateCreatorInterface *iface,Value *passes)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  undefined8 uVar1;
  ulonglong uVar2;
  bool bVar3;
  char cVar4;
  void *__s;
  ConstMemberIterator CVar5;
  Ch *__nptr;
  const_iterator cVar6;
  Type pGVar7;
  Number NVar8;
  ulong uVar9;
  size_t size;
  void *pvVar10;
  Pointer this_01;
  Hash hash;
  Data local_70;
  ulonglong local_60;
  StateCreatorInterface *local_58;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  Value *local_48;
  void *local_40;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_70.o.members = (Member *)this;
  local_58 = iface;
  if ((passes->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x49a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::MemberCount() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar9 = (ulong)(passes->data_).s.length;
  if (uVar9 == 0) {
    __s = (void *)0x0;
  }
  else {
    size = uVar9 << 6;
    __s = ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (__s != (void *)0x0) {
      memset(__s,0,size);
    }
    if ((passes->data_).f.flags != 3) {
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x4d8,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_01 = (Pointer)((ulong)(passes->data_).s.str & 0xffffffffffff);
  CVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(passes);
  if (CVar5.ptr_ != this_01) {
    local_38 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)((long)&((local_70.o.members)->name).data_ + 8);
    local_50 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)(local_70.s.str + 0xe8);
    uVar9 = 0;
    local_48 = passes;
    local_40 = __s;
    do {
      __nptr = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_01->name);
      local_60 = strtoull(__nptr,(char **)0x0,0x10);
      cVar6 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_38,&local_60);
      if (cVar6.super__Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        this_00 = &this_01->value;
        *(undefined4 *)((long)__s + uVar9 * 0x40) = 0x26;
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"flags");
        if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) {
          __assert_fail("data_.f.flags & kUintFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        pvVar10 = (void *)(uVar9 * 0x40 + (long)__s);
        *(SizeType *)((long)pvVar10 + 0x10) = (pGVar7->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar1 != NVar8.i64) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"attachments");
          if ((pGVar7->data_).f.flags != 4) goto LAB_0012132e;
          *(SizeType *)((long)pvVar10 + 0x14) = (pGVar7->data_).s.length;
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"attachments");
          parse_render_pass_attachments
                    ((Impl *)local_70.o.members,pGVar7,
                     (VkAttachmentDescription **)((long)pvVar10 + 0x18));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar1 != NVar8.i64) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"dependencies");
          if ((pGVar7->data_).f.flags != 4) goto LAB_0012132e;
          *(SizeType *)((long)pvVar10 + 0x30) = (pGVar7->data_).s.length;
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"dependencies");
          parse_render_pass_dependencies
                    ((Impl *)local_70.o.members,pGVar7,
                     (VkSubpassDependency **)((long)pvVar10 + 0x38));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar1 != NVar8.i64) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"subpasses");
          if ((pGVar7->data_).f.flags != 4) {
LAB_0012132e:
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          *(SizeType *)((long)pvVar10 + 0x20) = (pGVar7->data_).s.length;
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"subpasses");
          parse_render_pass_subpasses
                    ((Impl *)local_70.o.members,pGVar7,
                     (VkSubpassDescription **)((long)pvVar10 + 0x28));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_70.s,(Ch *)this_00);
        uVar1 = local_70.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        __s = local_40;
        passes = local_48;
        if (uVar1 != NVar8.i64) {
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pNext");
          bVar3 = parse_pnext_chain((Impl *)local_70.o.members,pGVar7,(void **)((long)pvVar10 + 8),
                                    (StateCreatorInterface *)0x0,(DatabaseInterface *)0x0,
                                    (Value *)0x0);
          if (!bVar3) {
            return false;
          }
        }
        uVar2 = local_60;
        std::__detail::
        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[](local_50,&local_60);
        cVar4 = (**(code **)(*(long *)local_58 + 0x48))(local_58,uVar2,pvVar10);
        if (cVar4 == '\0') {
          return false;
        }
      }
      this_01 = this_01 + 1;
      uVar9 = (ulong)((int)uVar9 + 1);
      CVar5 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(passes);
    } while (this_01 != CVar5.ptr_);
  }
  (**(code **)(*(long *)local_58 + 0x88))();
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_render_passes(StateCreatorInterface &iface, const Value &passes)
{
	auto *infos = allocator.allocate_n_cleared<VkRenderPassCreateInfo>(passes.MemberCount());

	unsigned index = 0;
	for (auto itr = passes.MemberBegin(); itr != passes.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_samplers.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("attachments"))
		{
			info.attachmentCount = obj["attachments"].Size();
			if (!parse_render_pass_attachments(obj["attachments"], &info.pAttachments))
				return false;
		}

		if (obj.HasMember("dependencies"))
		{
			info.dependencyCount = obj["dependencies"].Size();
			if (!parse_render_pass_dependencies(obj["dependencies"], &info.pDependencies))
				return false;
		}

		if (obj.HasMember("subpasses"))
		{
			info.subpassCount = obj["subpasses"].Size();
			if (!parse_render_pass_subpasses(obj["subpasses"], &info.pSubpasses))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_render_pass(hash, &info, &replayed_render_passes[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}